

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptGeneratorFunction.cpp
# Opt level: O2

PropertyQueryFlags __thiscall
Js::JavascriptGeneratorFunction::GetPropertyQuery
          (JavascriptGeneratorFunction *this,Var originalInstance,
          JavascriptString *propertyNameString,Var *value,PropertyValueInfo *info,
          ScriptContext *requestContext)

{
  PropertyQueryFlags PVar1;
  PropertyRecord *local_48;
  PropertyRecord *propertyRecord;
  PropertyValueInfo *local_38;
  
  propertyRecord = (PropertyRecord *)requestContext;
  local_38 = info;
  ScriptContext::FindPropertyRecord
            ((((((this->super_ScriptFunctionBase).super_JavascriptFunction.super_DynamicObject.
                 super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
             super_JavascriptLibraryBase).scriptContext.ptr,propertyNameString,&local_48);
  if ((local_48 == (PropertyRecord *)0x0) || ((local_48->pid | 2U) != 0x1cf)) {
    PVar1 = JavascriptFunction::GetPropertyQuery
                      ((JavascriptFunction *)this,originalInstance,propertyNameString,value,local_38
                       ,(ScriptContext *)propertyRecord);
  }
  else {
    PVar1 = DynamicObject::GetPropertyQuery
                      ((DynamicObject *)this,originalInstance,propertyNameString,value,local_38,
                       (ScriptContext *)propertyRecord);
  }
  return PVar1;
}

Assistant:

PropertyQueryFlags JavascriptGeneratorFunction::GetPropertyQuery(Var originalInstance, JavascriptString* propertyNameString, Var* value, PropertyValueInfo* info, ScriptContext* requestContext)
    {
        PropertyRecord const* propertyRecord;
        this->GetScriptContext()->FindPropertyRecord(propertyNameString, &propertyRecord);

        if (propertyRecord != nullptr)
        {
            if (propertyRecord->GetPropertyId() == PropertyIds::caller || propertyRecord->GetPropertyId() == PropertyIds::arguments)
            {
                // JavascriptFunction has special case for caller and arguments; call DynamicObject:: virtual directly to skip that.
                return DynamicObject::GetPropertyQuery(originalInstance, propertyNameString, value, info, requestContext);
            }
        }

        return JavascriptFunction::GetPropertyQuery(originalInstance, propertyNameString, value, info, requestContext);
    }